

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall
argsman_tests::CheckValueTest::CheckValue(CheckValueTest *this,uint flags,char *arg,Expect *expect)

{
  long lVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar2;
  reference pvVar3;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffef98;
  char *in_stack_ffffffffffffefa0;
  char *in_stack_ffffffffffffefa8;
  undefined1 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefb0;
  size_type in_stack_ffffffffffffefb8;
  const_string *in_stack_ffffffffffffefc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefc8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffefd0;
  ArgsManager *file;
  ArgsManager *in_stack_ffffffffffffefd8;
  ArgsManager *in_stack_ffffffffffffefe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ArgsManager *in_stack_ffffffffffffeff0;
  string *in_stack_fffffffffffff008;
  ArgsManager *in_stack_fffffffffffff010;
  string *in_stack_fffffffffffff050;
  ArgsManager *in_stack_fffffffffffff058;
  undefined8 in_stack_fffffffffffff060;
  int argc;
  ArgsManager *in_stack_fffffffffffff068;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff090;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff098;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff0a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff0a8;
  path *local_e68;
  bool success;
  Expect *expect_local;
  char *arg_local;
  CheckValueTest *this_local;
  const_string local_de8 [2];
  lazy_ostream local_dc8 [2];
  assertion_result local_da8 [2];
  const_string local_d70;
  lazy_ostream local_d60 [2];
  assertion_result local_d38 [2];
  undefined1 local_cf9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  lazy_ostream local_cc0 [2];
  assertion_result local_ca0 [2];
  string local_c62 [2];
  allocator<char> local_c0a;
  undefined1 local_c09;
  undefined1 local_c08 [16];
  undefined1 local_bf8 [69];
  undefined1 local_bb3 [2];
  undefined1 local_bb1;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [69];
  undefined1 local_b5b [2];
  undefined1 local_b59;
  undefined1 local_b58 [16];
  undefined1 local_b48 [64];
  const_string local_b08 [2];
  lazy_ostream local_ae8 [2];
  assertion_result local_ac8 [2];
  allocator<char> local_a89;
  int64_t local_a88;
  undefined1 local_a80 [16];
  undefined1 local_a70 [64];
  undefined1 local_a30 [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a29 [2];
  const_string local_9d0 [2];
  lazy_ostream local_9b0 [2];
  assertion_result local_990 [2];
  allocator<char> local_952;
  allocator<char> local_951;
  undefined1 local_950 [16];
  undefined1 local_940 [70];
  allocator<char> local_8fa;
  allocator<char> local_8f9;
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [64];
  undefined1 local_8a8 [16];
  undefined1 local_898 [64];
  const_string local_858 [2];
  lazy_ostream local_838 [2];
  assertion_result local_818 [2];
  size_type local_7e0;
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [64];
  const_string local_788 [2];
  lazy_ostream local_768 [2];
  assertion_result local_748 [2];
  undefined1 local_710 [16];
  undefined1 local_700 [68];
  __native_type local_6bc [2];
  __native_type local_65c [2];
  allocator<char> local_5f9;
  vector<UniValue,_std::allocator<UniValue>_> settings_list;
  allocator<char> local_5d9;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [100];
  uint flags_local;
  undefined1 local_440 [96];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [96];
  __native_type local_360;
  __native_type local_320 [2];
  undefined1 local_2c8 [32];
  string error;
  char *argv [2];
  undefined1 local_278 [40];
  TestArgsManager test;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flags_local = flags;
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_ffffffffffffef98);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_unsigned_int_&,_true>
            (in_stack_ffffffffffffefd0,(char (*) [7])in_stack_ffffffffffffefc8,
             (uint *)in_stack_ffffffffffffefc0);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_ffffffffffffef98);
  __l._M_len = (size_type)in_stack_ffffffffffffefe8;
  __l._M_array = (iterator)in_stack_ffffffffffffefe0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_ffffffffffffefd8,__l,(allocator_type *)in_stack_ffffffffffffefd0);
  TestArgsManager::SetupArgs
            ((TestArgsManager *)in_stack_ffffffffffffefe0,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)in_stack_ffffffffffffefd8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_ffffffffffffefa8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_ffffffffffffef98);
  local_e68 = (path *)&test;
  do {
    local_e68 = local_e68 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_ffffffffffffef98);
    argc = (int)((ulong)in_stack_fffffffffffff060 >> 0x20);
  } while (local_e68 != (path *)local_278);
  std::__cxx11::string::string(in_stack_ffffffffffffefb0);
  ArgsManager::ParseParameters
            (in_stack_fffffffffffff068,argc,(char **)in_stack_fffffffffffff058,
             in_stack_fffffffffffff050);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
               (unsigned_long)in_stack_ffffffffffffef98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffefd8,
               (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
               (unsigned_long)in_stack_ffffffffffffef98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
               (allocator<char> *)in_stack_ffffffffffffefd8);
    ArgsManager::GetSetting(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
    UniValue::write_abi_cxx11_((UniValue *)local_2c8,(int)local_320,(void *)0x0,0);
    UniValue::write_abi_cxx11_((UniValue *)&local_360.__data,(int)expect,(void *)0x0,0);
    in_stack_ffffffffffffefa8 = "expect.setting.write()";
    in_stack_ffffffffffffefa0 = (char *)&local_360;
    in_stack_ffffffffffffef98 = "test.GetSetting(\"-value\").write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_5c8,local_5d8,0x77,1,2,local_2c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffef98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef98);
    std::allocator<char>::~allocator(&local_5d9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
             (allocator<char> *)in_stack_ffffffffffffefd8);
  ArgsManager::GetSettingsList(in_stack_ffffffffffffefe0,(string *)in_stack_ffffffffffffefd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef98);
  std::allocator<char>::~allocator(&local_5f9);
  bVar2 = UniValue::isNull((UniValue *)in_stack_ffffffffffffef98);
  if ((bVar2) || (bVar2 = UniValue::isFalse((UniValue *)in_stack_ffffffffffffefa8), bVar2)) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      local_65c[0]._4_8_ =
           std::vector<UniValue,_std::allocator<UniValue>_>::size
                     ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffef98);
      local_65c[0].__data.__lock = 0;
      in_stack_ffffffffffffefa8 = "0U";
      in_stack_ffffffffffffefa0 = (char *)local_65c;
      in_stack_ffffffffffffef98 = "settings_list.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                ((undefined1 *)((long)&local_65c[0].__data.__list.__prev + 4),
                 &local_65c[0].__data.__nusers,0x7a,1,2,&local_65c[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      local_6bc[0]._4_8_ =
           std::vector<UniValue,_std::allocator<UniValue>_>::size
                     ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffef98);
      local_6bc[0].__data.__lock = 1;
      in_stack_ffffffffffffefa8 = "1U";
      in_stack_ffffffffffffefa0 = (char *)local_6bc;
      in_stack_ffffffffffffef98 = "settings_list.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                ((undefined1 *)((long)&local_6bc[0].__data.__list.__prev + 4),
                 &local_6bc[0].__data.__nusers,0x7c,1,2,&local_6bc[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      pvVar3 = std::vector<UniValue,_std::allocator<UniValue>_>::operator[]
                         ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffefa8,
                          (size_type)in_stack_ffffffffffffefa0);
      UniValue::write_abi_cxx11_((UniValue *)(local_3c0 + 0x20),(int)pvVar3,(void *)0x0,0);
      UniValue::write_abi_cxx11_((UniValue *)local_3c0,(int)expect,(void *)0x0,0);
      in_stack_ffffffffffffefa8 = "expect.setting.write()";
      in_stack_ffffffffffffefa0 = local_3c0;
      in_stack_ffffffffffffef98 = "settings_list[0].write()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_700,local_710,0x7d,1,2,local_3c0 + 0x20);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef98);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  if (expect->error == (char *)0x0) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffefa8,
                 SUB81((ulong)in_stack_ffffffffffffefa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      in_stack_ffffffffffffef98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_818,local_838,local_858,0x84,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffef98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      in_stack_ffffffffffffefa8 = "\"\"";
      in_stack_ffffffffffffefa0 = "";
      in_stack_ffffffffffffef98 = "error";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
                (local_898,local_8a8,0x85,1,2,&error);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffefa8,
                 SUB81((ulong)in_stack_ffffffffffffefa0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      in_stack_ffffffffffffef98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_748,local_768,local_788,0x81,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffef98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      local_7e0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(in_stack_ffffffffffffefc8,(char *)in_stack_ffffffffffffefc0,
                       in_stack_ffffffffffffefb8);
      in_stack_ffffffffffffefa8 = "std::string::npos";
      in_stack_ffffffffffffefa0 = (char *)&std::__cxx11::string::npos;
      in_stack_ffffffffffffef98 = "error.find(expect.error)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::ne_impl,unsigned_long,unsigned_long>
                (local_7c8,local_7d8,0x82,1,3,&local_7e0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  if ((expect->default_string & 1U) == 0) {
    if (expect->string_value == (char *)0x0) {
      do {
        in_stack_fffffffffffff0a8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                   (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffefa8,
                   SUB81((ulong)in_stack_ffffffffffffefa0 >> 0x38,0));
        in_stack_fffffffffffff0a0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffefa0,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        in_stack_ffffffffffffef98 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_990,local_9b0,local_9d0,0x8d,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffef98);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffef98);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                   (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                   (allocator<char> *)in_stack_ffffffffffffefd8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                   (allocator<char> *)in_stack_ffffffffffffefd8);
        ArgsManager::GetArg(in_stack_ffffffffffffefd8,&in_stack_ffffffffffffefd0->first,
                            in_stack_ffffffffffffefc8);
        in_stack_ffffffffffffefa0 = (char *)&expect->string_value;
        in_stack_ffffffffffffefa8 = "expect.string_value";
        in_stack_ffffffffffffef98 = "test.GetArg(\"-value\", \"zzzzz\")";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char_const*>
                  (local_940,local_950,0x8b,1,2,local_440);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef98);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef98);
        std::allocator<char>::~allocator(&local_952);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef98);
        std::allocator<char>::~allocator(&local_951);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffef98);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                 (allocator<char> *)in_stack_ffffffffffffefd8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                 (allocator<char> *)in_stack_ffffffffffffefd8);
      ArgsManager::GetArg(in_stack_ffffffffffffefd8,&in_stack_ffffffffffffefd0->first,
                          in_stack_ffffffffffffefc8);
      in_stack_ffffffffffffefa8 = "\"zzzzz\"";
      in_stack_ffffffffffffefa0 = "zzzzz";
      in_stack_ffffffffffffef98 = "test.GetArg(\"-value\", \"zzzzz\")";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
                (local_8e8,local_8f8,0x89,1,2,local_3e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef98);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef98);
      std::allocator<char>::~allocator(&local_8fa);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef98);
      std::allocator<char>::~allocator(&local_8f9);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  if ((expect->default_int & 1U) == 0) {
    bVar2 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffef98);
    if (bVar2) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                   (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                   (allocator<char> *)in_stack_ffffffffffffefd8);
        local_a88 = ArgsManager::GetIntArg
                              ((ArgsManager *)in_stack_ffffffffffffefa0,
                               (string *)in_stack_ffffffffffffef98,
                               (int64_t)in_stack_ffffffffffffefa8);
        in_stack_ffffffffffffefa0 =
             (char *)std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffef98);
        in_stack_ffffffffffffefa8 = "*expect.int_value";
        in_stack_ffffffffffffef98 = "test.GetIntArg(\"-value\", 99999)";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                  (local_a70,local_a80,0x93,1,2,&local_a88);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef98);
        std::allocator<char>::~allocator(&local_a89);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffef98);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                   (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffefa8,
                   SUB81((ulong)in_stack_ffffffffffffefa0 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffefa0,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        in_stack_ffffffffffffef98 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_ac8,local_ae8,local_b08,0x95,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffef98);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffef98);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
  }
  else {
    do {
      in_stack_fffffffffffff098._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      in_stack_fffffffffffff090._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a30 + 7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                 (allocator<char> *)in_stack_ffffffffffffefd8);
      local_a29[0]._1_8_ =
           ArgsManager::GetIntArg
                     ((ArgsManager *)in_stack_ffffffffffffefa0,(string *)in_stack_ffffffffffffef98,
                      (int64_t)in_stack_ffffffffffffefa8);
      local_a30._0_4_ = 99999;
      in_stack_ffffffffffffefa8 = "99999";
      in_stack_ffffffffffffefa0 = local_a30;
      in_stack_ffffffffffffef98 = "test.GetIntArg(\"-value\", 99999)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_a29[0].field_2 + 9),
                 (undefined1 *)((long)&local_a29[0]._M_string_length + 1),0x91,1,2,
                 (undefined1 *)((long)&local_a29[0]._M_dataplus._M_p + 1));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef98);
      std::allocator<char>::~allocator((allocator<char> *)(local_a30 + 7));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  if ((expect->default_bool & 1U) == 0) {
    bVar2 = std::optional::operator_cast_to_bool((optional<bool> *)in_stack_ffffffffffffef98);
    if (bVar2) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                   (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        uVar4 = (undefined1)((ulong)in_stack_ffffffffffffefa8 >> 0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                   (allocator<char> *)in_stack_ffffffffffffefd8);
        local_c09 = ArgsManager::GetBoolArg
                              ((ArgsManager *)in_stack_ffffffffffffefa0,
                               (string *)in_stack_ffffffffffffef98,(bool)uVar4);
        in_stack_ffffffffffffefa0 =
             std::optional<bool>::operator*((optional<bool> *)in_stack_ffffffffffffef98);
        in_stack_ffffffffffffefa8 = "*expect.bool_value";
        in_stack_ffffffffffffef98 = "test.GetBoolArg(\"-value\", false)";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                  (local_bf8,local_c08,0x9c,1,2,&local_c09);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef98);
        std::allocator<char>::~allocator(&local_c0a);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffef98);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        in_stack_fffffffffffff010 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                   (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        uVar4 = (undefined1)((ulong)in_stack_ffffffffffffefa8 >> 0x38);
        in_stack_fffffffffffff008 = local_c62;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                   (allocator<char> *)in_stack_ffffffffffffefd8);
        local_c62[0]._M_dataplus._M_p._1_1_ =
             ArgsManager::GetBoolArg
                       ((ArgsManager *)in_stack_ffffffffffffefa0,(string *)in_stack_ffffffffffffef98
                        ,(bool)uVar4);
        in_stack_ffffffffffffefa0 =
             std::optional<bool>::operator*((optional<bool> *)in_stack_ffffffffffffef98);
        in_stack_ffffffffffffefa8 = "*expect.bool_value";
        in_stack_ffffffffffffef98 = "test.GetBoolArg(\"-value\", true)";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                  ((undefined1 *)((long)&local_c62[0].field_2 + 2),
                   (undefined1 *)((long)&local_c62[0]._M_dataplus._M_p + 2),0x9d,1,2,
                   (undefined1 *)((long)&local_c62[0]._M_dataplus._M_p + 1));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef98);
        std::allocator<char>::~allocator((allocator<char> *)local_c62);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_ffffffffffffef98);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                   (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                   in_stack_ffffffffffffefc0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffefa8,
                   SUB81((ulong)in_stack_ffffffffffffefa0 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffefa0,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffef98);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                   (unsigned_long)in_stack_ffffffffffffef98);
        in_stack_ffffffffffffef98 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_ca0,local_cc0,(const_string *)&stack0xfffffffffffff320,0x9f,CHECK,
                   CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffef98);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffef98);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
  }
  else {
    do {
      in_stack_fffffffffffff058 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      uVar4 = (undefined1)((ulong)in_stack_ffffffffffffefa8 >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                 (allocator<char> *)in_stack_ffffffffffffefd8);
      local_b59 = ArgsManager::GetBoolArg
                            ((ArgsManager *)in_stack_ffffffffffffefa0,
                             (string *)in_stack_ffffffffffffef98,(bool)uVar4);
      local_b5b[0] = '\0';
      in_stack_ffffffffffffefa8 = "false";
      in_stack_ffffffffffffefa0 = local_b5b;
      in_stack_ffffffffffffef98 = "test.GetBoolArg(\"-value\", false)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_b48,local_b58,0x99,1,2,&local_b59);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef98);
      std::allocator<char>::~allocator((allocator<char> *)(local_b5b + 1));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      uVar4 = (undefined1)((ulong)in_stack_ffffffffffffefa8 >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffefe8,(char *)in_stack_ffffffffffffefe0,
                 (allocator<char> *)in_stack_ffffffffffffefd8);
      local_bb1 = ArgsManager::GetBoolArg
                            ((ArgsManager *)in_stack_ffffffffffffefa0,
                             (string *)in_stack_ffffffffffffef98,(bool)uVar4);
      local_bb3[0] = '\x01';
      in_stack_ffffffffffffefa8 = "true";
      in_stack_ffffffffffffefa0 = local_bb3;
      in_stack_ffffffffffffef98 = "test.GetBoolArg(\"-value\", true)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_ba0,local_bb0,0x9a,1,2,&local_bb1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffef98);
      std::allocator<char>::~allocator((allocator<char> *)(local_bb3 + 1));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_ffffffffffffef98);
  if (bVar2) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_cf9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_ffffffffffffefe0,
               (allocator<char> *)in_stack_ffffffffffffefd8);
    ArgsManager::GetArgs(in_stack_fffffffffffff010,in_stack_fffffffffffff008);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef98);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,
                 (const_string *)in_stack_ffffffffffffefd0,(size_t)in_stack_ffffffffffffefc8,
                 in_stack_ffffffffffffefc0);
      in_stack_ffffffffffffefd8 = (ArgsManager *)&l;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffefa0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffefa0);
      std::
      optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffef98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffefa0);
      std::
      optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffef98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffefa0);
      boost::test_tools::tt_detail::equal_coll_impl::operator()
                ((equal_coll_impl *)in_stack_fffffffffffff058,in_stack_fffffffffffff0a8,
                 in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,in_stack_fffffffffffff090);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,(char (*) [1])in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      in_stack_ffffffffffffefa8 = "l.end()";
      in_stack_ffffffffffffefa0 = "l.begin()";
      in_stack_ffffffffffffef98 = &DAT_00000004;
      boost::test_tools::tt_detail::report_assertion
                (local_d38,local_d60,&local_d70,0xa4,CHECK,CHECK_EQUAL_COLL);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffef98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffefa8);
  }
  else {
    do {
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffefd8,(const_string *)file,
                 (size_t)in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffefa8,
                 SUB81((ulong)in_stack_ffffffffffffefa0 >> 0x38,0));
      in_stack_ffffffffffffefc8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffefa0,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffef98);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                 (unsigned_long)in_stack_ffffffffffffef98);
      in_stack_ffffffffffffef98 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_da8,local_dc8,local_de8,0xa6,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffef98);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffef98);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffefa8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffef98);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_ffffffffffffef98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CheckValue(unsigned int flags, const char* arg, const Expect& expect)
    {
        TestArgsManager test;
        test.SetupArgs({{"-value", flags}});
        const char* argv[] = {"ignored", arg};
        std::string error;
        bool success = test.ParseParameters(arg ? 2 : 1, argv, error);

        BOOST_CHECK_EQUAL(test.GetSetting("-value").write(), expect.setting.write());
        auto settings_list = test.GetSettingsList("-value");
        if (expect.setting.isNull() || expect.setting.isFalse()) {
            BOOST_CHECK_EQUAL(settings_list.size(), 0U);
        } else {
            BOOST_CHECK_EQUAL(settings_list.size(), 1U);
            BOOST_CHECK_EQUAL(settings_list[0].write(), expect.setting.write());
        }

        if (expect.error) {
            BOOST_CHECK(!success);
            BOOST_CHECK_NE(error.find(expect.error), std::string::npos);
        } else {
            BOOST_CHECK(success);
            BOOST_CHECK_EQUAL(error, "");
        }

        if (expect.default_string) {
            BOOST_CHECK_EQUAL(test.GetArg("-value", "zzzzz"), "zzzzz");
        } else if (expect.string_value) {
            BOOST_CHECK_EQUAL(test.GetArg("-value", "zzzzz"), expect.string_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.default_int) {
            BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), 99999);
        } else if (expect.int_value) {
            BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), *expect.int_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.default_bool) {
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), false);
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), true);
        } else if (expect.bool_value) {
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), *expect.bool_value);
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), *expect.bool_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.list_value) {
            auto l = test.GetArgs("-value");
            BOOST_CHECK_EQUAL_COLLECTIONS(l.begin(), l.end(), expect.list_value->begin(), expect.list_value->end());
        } else {
            BOOST_CHECK(!success);
        }
    }